

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShaders.hpp
# Opt level: O0

void __thiscall rr::FragmentShader::~FragmentShader(FragmentShader *this)

{
  FragmentShader *this_local;
  
  this->_vptr_FragmentShader = (_func_int **)&PTR___cxa_pure_virtual_01593988;
  std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::~vector
            (&this->m_outputs);
  std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::~vector
            (&this->m_inputs);
  return;
}

Assistant:

~FragmentShader		(void) {}